

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O0

errr Term_draw(wchar_t x,wchar_t y,wchar_t a,wchar_t c)

{
  wchar_t h;
  wchar_t w;
  wchar_t c_local;
  wchar_t a_local;
  wchar_t y_local;
  wchar_t x_local;
  
  if ((x < L'\0') || (Term->wid <= x)) {
    y_local = L'\xffffffff';
  }
  else if ((y < L'\0') || (Term->hgt <= y)) {
    y_local = L'\xffffffff';
  }
  else if (c == L'\0') {
    y_local = L'\xfffffffe';
  }
  else {
    Term_queue_char(Term,x,y,a,c,L'\0',L'\0');
    y_local = L'\0';
  }
  return y_local;
}

Assistant:

errr Term_draw(int x, int y, int a, wchar_t c)
{
	int w = Term->wid;
	int h = Term->hgt;

	/* Verify location */
	if ((x < 0) || (x >= w)) return (-1);
	if ((y < 0) || (y >= h)) return (-1);

	/* Paranoia -- illegal char */
	if (!c) return (-2);

	/* Queue it for later */
	Term_queue_char(Term, x, y, a, c, 0, 0);

	/* Success */
	return (0);
}